

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_timer.c
# Opt level: O3

int amqp_timer_update(amqp_timer_t *timer,timeval *timeout)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  timespec tp;
  timespec local_20;
  
  if (timer->current_timestamp == 0) {
    iVar1 = clock_gettime(1,&local_20);
    if (iVar1 != -1) {
      uVar4 = local_20.tv_sec * 1000000000 + local_20.tv_nsec;
      timer->current_timestamp = uVar4;
      if (uVar4 == 0) {
        return -0xe;
      }
      uVar2 = timeout->tv_usec * 1000 + timeout->tv_sec * 1000000000 + uVar4;
      timer->timeout_timestamp = uVar2;
      goto LAB_0010bf87;
    }
  }
  else {
    iVar1 = clock_gettime(1,&local_20);
    if (iVar1 != -1) {
      uVar4 = local_20.tv_sec * 1000000000 + local_20.tv_nsec;
      timer->current_timestamp = uVar4;
      if (uVar4 == 0) {
        return -0xe;
      }
      uVar2 = timer->timeout_timestamp;
LAB_0010bf87:
      uVar3 = uVar2 - uVar4;
      if (uVar4 <= uVar2) {
        timer->ns_until_next_timeout = uVar3;
        (timer->tv).tv_sec = uVar3 / 1000000000;
        (timer->tv).tv_usec = (uVar3 % 1000000000) / 1000;
        return 0;
      }
      return -0xd;
    }
  }
  timer->current_timestamp = 0;
  return -0xe;
}

Assistant:

int
amqp_timer_update(amqp_timer_t *timer, struct timeval *timeout)
{
  if (0 == timer->current_timestamp) {
    timer->current_timestamp = amqp_get_monotonic_timestamp();

    if (0 == timer->current_timestamp) {
      return AMQP_STATUS_TIMER_FAILURE;
    }

    timer->timeout_timestamp = timer->current_timestamp +
                               (uint64_t)timeout->tv_sec * AMQP_NS_PER_S +
                               (uint64_t)timeout->tv_usec * AMQP_NS_PER_US;

  } else {
    timer->current_timestamp = amqp_get_monotonic_timestamp();

    if (0 == timer->current_timestamp) {
      return AMQP_STATUS_TIMER_FAILURE;
    }
  }

  if (timer->current_timestamp > timer->timeout_timestamp) {
    return AMQP_STATUS_TIMEOUT;
  }

  timer->ns_until_next_timeout = timer->timeout_timestamp - timer->current_timestamp;

  memset(&timer->tv, 0, sizeof(struct timeval));
  timer->tv.tv_sec = timer->ns_until_next_timeout / AMQP_NS_PER_S;
  timer->tv.tv_usec = (timer->ns_until_next_timeout % AMQP_NS_PER_S) / AMQP_NS_PER_US;

  return AMQP_STATUS_OK;
}